

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest16::deinit(FunctionalTest16 *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    if (*(int *)((long)this->m_fs_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x470))();
      *(undefined4 *)((long)this->m_fs_ids + lVar3) = 0;
    }
    if (*(int *)((long)this->m_fs_po_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x448))();
      *(undefined4 *)((long)this->m_fs_po_ids + lVar3) = 0;
    }
    if (*(int *)((long)this->m_gs_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x470))();
      *(undefined4 *)((long)this->m_gs_ids + lVar3) = 0;
    }
    if (*(int *)((long)this->m_gs_po_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x448))();
      *(undefined4 *)((long)this->m_gs_po_ids + lVar3) = 0;
    }
    if (*(int *)((long)this->m_pipeline_object_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x450))(1,(long)this->m_pipeline_object_ids + lVar3);
    }
    if (*(int *)((long)this->m_po_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x448))();
      *(undefined4 *)((long)this->m_po_ids + lVar3) = 0;
    }
    if (*(int *)((long)this->m_tc_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x470))();
      *(undefined4 *)((long)this->m_tc_ids + lVar3) = 0;
    }
    if (*(int *)((long)this->m_tc_po_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x448))();
      *(undefined4 *)((long)this->m_tc_po_ids + lVar3) = 0;
    }
    if (*(int *)((long)this->m_te_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x470))();
      *(undefined4 *)((long)this->m_te_ids + lVar3) = 0;
    }
    if (*(int *)((long)this->m_te_po_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x448))();
      *(undefined4 *)((long)this->m_te_po_ids + lVar3) = 0;
    }
    if (*(int *)((long)this->m_vs_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x470))();
      *(undefined4 *)((long)this->m_vs_ids + lVar3) = 0;
    }
    if (*(int *)((long)this->m_vs_po_ids + lVar3) != 0) {
      (**(code **)(lVar2 + 0x448))();
      *(undefined4 *)((long)this->m_vs_po_ids + lVar3) = 0;
    }
  }
  return;
}

Assistant:

void FunctionalTest16::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int n_id = 0; n_id < 2; ++n_id)
	{
		if (m_fs_ids[n_id] != 0)
		{
			gl.deleteShader(m_fs_ids[n_id]);

			m_fs_ids[n_id] = 0;
		}

		if (m_fs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_fs_po_ids[n_id]);

			m_fs_po_ids[n_id] = 0;
		}

		if (m_gs_ids[n_id] != 0)
		{
			gl.deleteShader(m_gs_ids[n_id]);

			m_gs_ids[n_id] = 0;
		}

		if (m_gs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_gs_po_ids[n_id]);

			m_gs_po_ids[n_id] = 0;
		}

		if (m_pipeline_object_ids[n_id] != 0)
		{
			gl.deleteProgramPipelines(1 /* n */, m_pipeline_object_ids + n_id);
		}

		if (m_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_po_ids[n_id]);

			m_po_ids[n_id] = 0;
		}

		if (m_tc_ids[n_id] != 0)
		{
			gl.deleteShader(m_tc_ids[n_id]);

			m_tc_ids[n_id] = 0;
		}

		if (m_tc_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_tc_po_ids[n_id]);

			m_tc_po_ids[n_id] = 0;
		}

		if (m_te_ids[n_id] != 0)
		{
			gl.deleteShader(m_te_ids[n_id]);

			m_te_ids[n_id] = 0;
		}

		if (m_te_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_te_po_ids[n_id]);

			m_te_po_ids[n_id] = 0;
		}

		if (m_vs_ids[n_id] != 0)
		{
			gl.deleteShader(m_vs_ids[n_id]);

			m_vs_ids[n_id] = 0;
		}

		if (m_vs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_vs_po_ids[n_id]);

			m_vs_po_ids[n_id] = 0;
		}
	} /* for (both IDs) */
}